

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O1

IConnection * __thiscall
tonk::ConnectionAddrMap::FindByAddr(ConnectionAddrMap *this,UDPAddress *addr)

{
  atomic<int> *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  raw_node *prVar11;
  IConnection *pIVar12;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->AddressMapLock);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  bVar5 = asio::ip::operator==(addr,&this->RecentAddress);
  if (bVar5) {
    pIVar12 = this->RecentConnection;
    goto LAB_0014a0fb;
  }
  if ((this->AddressMap).TheMap.m_num_valid == 0) {
LAB_0014a0b4:
    uVar9 = 0xffffffff;
  }
  else {
    uVar7 = HashUDPAddress(addr);
    uVar8 = (uint)((int)uVar7 * -0x61c88647) >>
            ((byte)(this->AddressMap).TheMap.m_hash_shift & 0x1f);
    prVar11 = (this->AddressMap).TheMap.m_values;
    uVar9 = uVar8;
    if (prVar11[uVar8].m_bits[0x28] == '\0') {
LAB_0014a0ae:
      bVar5 = true;
    }
    else {
      prVar11 = prVar11 + uVar8;
      bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar11,addr);
      if (bVar5) {
        bVar5 = false;
      }
      else {
        uVar10 = (ulong)uVar8;
        do {
          if ((int)uVar10 == 0) {
            uVar10 = (ulong)((this->AddressMap).TheMap.m_values_count - 1);
            prVar11 = (this->AddressMap).TheMap.m_values + uVar10;
          }
          else {
            uVar10 = (ulong)((int)uVar10 - 1);
            prVar11 = prVar11 + -1;
          }
          uVar9 = (uint)uVar10;
          if ((uVar9 == uVar8) || (prVar11->m_bits[0x28] == '\0')) goto LAB_0014a0ae;
          bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar11,addr);
        } while (!bVar5);
        bVar5 = false;
      }
    }
    if (bVar5) goto LAB_0014a0b4;
  }
  if ((int)uVar9 < 0) {
    pIVar12 = (IConnection *)0x0;
  }
  else {
    pIVar12 = *(IConnection **)((this->AddressMap).TheMap.m_values[uVar9].m_bits + 0x20);
  }
  if (pIVar12 == (IConnection *)0x0) {
    pIVar12 = (IConnection *)0x0;
  }
  else {
    uVar2 = *(undefined8 *)&(addr->impl_).data_;
    uVar3 = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
    uVar4 = *(undefined8 *)((long)&(addr->impl_).data_ + 0x14);
    *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0xc) =
         *(undefined8 *)((long)&(addr->impl_).data_ + 0xc);
    *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0x14) = uVar4;
    *(undefined8 *)&(this->RecentAddress).impl_.data_ = uVar2;
    *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 8) = uVar3;
    this->RecentConnection = pIVar12;
  }
LAB_0014a0fb:
  if (pIVar12 != (IConnection *)0x0) {
    LOCK();
    paVar1 = &(pIVar12->SelfRefCount).RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->AddressMapLock);
  return pIVar12;
}

Assistant:

IConnection* ConnectionAddrMap::FindByAddr(const UDPAddress& addr)
{
    TONK_DEBUG_ASSERT(!addr.address().is_unspecified());

    Locker locker(AddressMapLock);

    IConnection* connection;

    if (addr == RecentAddress) {
        connection = RecentConnection;
    }
    else
    {
        connection = AddressMap.Find(addr);
        if (connection)
        {
            RecentAddress = addr;
            RecentConnection = connection;
        }
    }

    if (connection) {
        connection->SelfRefCount.IncrementReferences();
    }
    return connection;
}